

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  long lVar3;
  uint uVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Net *pNVar10;
  Game *pGVar11;
  ostream *poVar12;
  long lVar13;
  invalid_argument *piVar14;
  string *psVar15;
  string *__val;
  uint __len;
  Graphic graphic;
  dialogbox dialog;
  int y;
  int x;
  string input;
  string arg;
  string pass;
  string ip;
  string sx;
  Graphic local_2da;
  dialogbox local_2d9;
  Game *local_2d8;
  string *local_2d0;
  Net *local_2c8;
  int local_2c0;
  int local_2bc;
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8 [16];
  undefined1 *local_298;
  undefined8 local_290;
  undefined1 local_288 [16];
  undefined1 *local_278;
  long local_270;
  undefined1 local_268 [16];
  undefined1 *local_258;
  long local_250;
  undefined1 local_248 [16];
  string local_238;
  undefined1 *local_218 [2];
  undefined1 local_208 [16];
  string local_1f8;
  string local_1d8;
  string local_1b8 [4];
  ios_base local_138 [264];
  
  local_258 = local_248;
  local_250 = 0;
  local_248[0] = 0;
  local_278 = local_268;
  local_270 = 0;
  local_268[0] = 0;
  local_298 = local_288;
  local_290 = 0;
  local_288[0] = 0;
  local_2d8 = (Game *)0x0;
  local_2c8 = (Net *)0x0;
  iVar7 = intGetOption(anon_var_dwarf_11544);
  if (iVar7 == 0) {
    iVar8 = intGetOption(anon_var_dwarf_11567);
    if (iVar8 == 0) {
      pGVar11 = (Game *)operator_new(0x20);
      Game::Game(pGVar11);
      local_2d8 = pGVar11;
    }
    else {
      local_1b8[0]._M_string_length = 0;
      local_1b8[0].field_2._M_local_buf[0] = '\0';
      local_2b0 = 0;
      local_2a8[0] = 0;
      local_2b8 = local_2a8;
      local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
      iVar8 = intGetOption(anon_var_dwarf_1157d);
      iVar9 = intGetOption(anon_var_dwarf_11593);
      if ((8 < iVar8) || (8 < iVar9)) {
        piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar14,"");
        __cxa_throw(piVar14,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      pGVar11 = (Game *)operator_new(0x20);
      Game::Game(pGVar11,iVar8,iVar9);
      local_2d8 = pGVar11;
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8[0]._M_dataplus._M_p != &local_1b8[0].field_2) {
        operator_delete(local_1b8[0]._M_dataplus._M_p);
      }
    }
    iVar8 = -1;
    bVar6 = true;
    goto LAB_0010634d;
  }
  if (iVar7 != 1) {
    piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar14,"");
LAB_00106f4e:
    __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pNVar10 = (Net *)operator_new(0x18);
  Net::Net(pNVar10);
  local_2c8 = pNVar10;
  strGetOption_abi_cxx11_(local_1b8,anon_var_dwarf_115b3);
  std::__cxx11::string::operator=((string *)&local_258,(string *)local_1b8);
  paVar1 = &local_1b8[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8[0]._M_dataplus._M_p);
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_258,local_258 + local_250);
  iVar8 = Net::makeconnect(pNVar10,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (iVar8 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_115c9,0x1f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    iVar7 = 1;
    std::ostream::flush();
    goto LAB_00106e81;
  }
  iVar8 = intGetOption(anon_var_dwarf_115df);
  if (iVar8 == 2) {
    local_2d0 = (string *)Net::automatch(pNVar10);
    if (local_2d0 != (string *)0xffffffffffffffff) {
      if (local_2d0 == (string *)0x0) {
        pGVar11 = (Game *)operator_new(0x20);
        Game::Game(pGVar11);
        local_2d8 = pGVar11;
        Net::makeroom(pNVar10,pGVar11->board->boardx / 2,pGVar11->board->boardy / 2);
        iVar8 = -1;
        bVar6 = true;
        local_2d0 = (string *)0x0;
        goto LAB_0010634d;
      }
      Net::login((Net *)local_1b8,(longlong)pNVar10);
      iVar8 = local_1b8[0]._M_dataplus._M_p._4_4_;
      if (local_1b8[0]._M_dataplus._M_p._4_4_ == -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_115c9,0x1f);
        iVar7 = 1;
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        goto LAB_00106e81;
      }
      iVar9 = (int)local_1b8[0]._M_dataplus._M_p;
      pGVar11 = (Game *)operator_new(0x20);
      Game::Game(pGVar11,iVar8,iVar9);
      goto LAB_0010690f;
    }
    iVar8 = 2;
    pGVar11 = (Game *)0x0;
  }
  else {
    if (iVar8 != 1) {
      if (iVar8 != 0) {
        piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar14,"");
        goto LAB_00106f4e;
      }
      iVar8 = intGetOption(anon_var_dwarf_11567);
      if (iVar8 == 0) {
        pGVar11 = (Game *)operator_new(0x20);
        Game::Game(pGVar11);
        local_2d8 = pGVar11;
      }
      else {
        local_1b8[0]._M_string_length = 0;
        local_1b8[0].field_2._M_local_buf[0] = '\0';
        local_2b8 = local_2a8;
        local_2b0 = 0;
        local_2a8[0] = 0;
        local_1b8[0]._M_dataplus._M_p = (pointer)paVar1;
        iVar8 = intGetOption(anon_var_dwarf_1157d);
        iVar9 = intGetOption(anon_var_dwarf_11593);
        if ((8 < iVar8) || (8 < iVar9)) {
          piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument(piVar14,"");
          __cxa_throw(piVar14,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        pGVar11 = (Game *)operator_new(0x20);
        Game::Game(pGVar11,iVar8,iVar9);
        local_2d8 = pGVar11;
        if (local_2b8 != local_2a8) {
          operator_delete(local_2b8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b8[0]._M_dataplus._M_p);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_115f5,0x25);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      poVar12 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,anon_var_dwarf_1160b,0x22);
      std::operator>>((istream *)&std::cin,(string *)&local_298);
      iVar8 = std::__cxx11::string::compare((char *)&local_298);
      if (iVar8 == 0) {
        strGetOption_abi_cxx11_(local_1b8,anon_var_dwarf_11637);
        std::__cxx11::string::operator=((string *)&local_278,(string *)local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1b8[0]._M_dataplus._M_p);
        }
        iVar8 = pGVar11->board->boardx;
        iVar9 = pGVar11->board->boardy;
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,local_278,local_278 + local_270);
        local_2d0 = (string *)Net::makeroom(pNVar10,iVar8 / 2,iVar9 / 2,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p);
        }
      }
      else {
        local_2d0 = (string *)
                    Net::makeroom(pNVar10,pGVar11->board->boardx / 2,pGVar11->board->boardy / 2);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_1164d,0xd);
      *(uint *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      poVar12 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      lVar13 = *(long *)poVar12;
      lVar3 = *(long *)(lVar13 + -0x18);
      *(uint *)(poVar12 + lVar3 + 0x18) = *(uint *)(poVar12 + lVar3 + 0x18) & 0xffffffb5 | 2;
      std::ios::widen((char)*(undefined8 *)(lVar13 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      iVar8 = -1;
      bVar6 = true;
      goto LAB_0010634d;
    }
    *(uint *)(std::invalid_argument::invalid_argument + *(long *)(std::cin + -0x18)) =
         *(uint *)(std::invalid_argument::invalid_argument + *(long *)(std::cin + -0x18)) &
         0xffffffb5 | 8;
    local_2d0 = (string *)llGetOption(anon_var_dwarf_11663);
    *(uint *)(std::invalid_argument::invalid_argument + *(long *)(std::cin + -0x18)) =
         *(uint *)(std::invalid_argument::invalid_argument + *(long *)(std::cin + -0x18)) &
         0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_11679,0x2e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
    std::ostream::put('`');
    poVar12 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,anon_var_dwarf_1168f,0x34);
    std::operator>>((istream *)&std::cin,(string *)&local_298);
    iVar8 = std::__cxx11::string::compare((char *)&local_298);
    if ((iVar8 != 0) && (iVar8 = std::__cxx11::string::compare((char *)&local_298), iVar8 != 0)) {
      piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar14,"");
      __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    iVar8 = std::__cxx11::string::compare((char *)&local_298);
    if (iVar8 == 0) {
      strGetOption_abi_cxx11_(local_1b8,anon_var_dwarf_11637);
      std::__cxx11::string::operator=((string *)&local_278,(string *)local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1b8[0]._M_dataplus._M_p);
      }
      local_218[0] = local_208;
      std::__cxx11::string::_M_construct<char*>((string *)local_218,local_278,local_278 + local_270)
      ;
      Net::login((Net *)local_1b8,(longlong)pNVar10,local_2d0);
      iVar8 = (int)local_1b8[0]._M_dataplus._M_p;
      iVar9 = local_1b8[0]._M_dataplus._M_p._4_4_;
      if (local_218[0] != local_208) {
        operator_delete(local_218[0]);
      }
    }
    else {
      Net::login((Net *)local_1b8,(longlong)pNVar10);
      iVar8 = (int)local_1b8[0]._M_dataplus._M_p;
      iVar9 = local_1b8[0]._M_dataplus._M_p._4_4_;
    }
    if (iVar9 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_115c9,0x1f);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      iVar7 = 1;
      std::ostream::flush();
      goto LAB_00106e81;
    }
    pGVar11 = (Game *)operator_new(0x20);
    Game::Game(pGVar11,iVar9,iVar8);
LAB_0010690f:
    iVar8 = 1;
    local_2d8 = pGVar11;
  }
  bVar6 = false;
LAB_0010634d:
  Graphic::Graphic(&local_2da);
  dialogbox::dialogbox(&local_2d9);
  Graphic::StartGame(&local_2da);
  Graphic::Put(&local_2da,&pGVar11->board->delta);
  if (iVar7 == 1) {
    Graphic::netchangeturn(&local_2da,pGVar11->turn,iVar8);
    if (bVar6) {
      __val = (string *)-(long)local_2d0;
      if (0 < (long)local_2d0) {
        __val = local_2d0;
      }
      __len = 1;
      if ((string *)0x9 < __val) {
        psVar15 = __val;
        uVar4 = 4;
        do {
          __len = uVar4;
          if (psVar15 < (string *)0x64) {
            __len = __len - 2;
            goto LAB_00106929;
          }
          if (psVar15 < (string *)0x3e8) {
            __len = __len - 1;
            goto LAB_00106929;
          }
          if (psVar15 < (string *)0x2710) goto LAB_00106929;
          bVar6 = (string *)0x1869f < psVar15;
          psVar15 = (string *)((ulong)psVar15 / 10000);
          uVar4 = __len + 4;
        } while (bVar6);
        __len = __len + 1;
      }
LAB_00106929:
      lVar13 = (long)local_2d0 >> 0x3f;
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_238,(char)__len - (char)((long)local_2d0 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long_long>
                (local_238._M_dataplus._M_p + -lVar13,__len,(unsigned_long_long)__val);
      Graphic::netwait(&local_2da,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
    }
  }
  else {
    Graphic::changeturn(&local_2da,pGVar11->turn);
  }
  local_2b8 = local_2a8;
  local_2b0 = 0;
  local_2a8[0] = 0;
  psVar2 = &local_1b8[0]._M_string_length;
  local_2d0 = (string *)((ulong)local_2d0 & 0xffffffff00000000);
LAB_001069be:
  pNVar10 = local_2c8;
  if (iVar7 == 1) {
    do {
      if ((pNVar10->closed != 0) || ((iVar8 == local_2d8->turn && (pNVar10->ready != 0)))) break;
      Net::get_abi_cxx11_((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
                           *)local_1b8,pNVar10);
      lVar13 = std::__cxx11::string::find((char *)psVar2,0x10b670,0);
      if ((lVar13 == -1) &&
         (lVar13 = std::__cxx11::string::find((char *)psVar2,0x10b677,0), lVar13 == -1)) {
        lVar13 = std::__cxx11::string::find((char *)psVar2,0x10b67d,0);
        pGVar11 = local_2d8;
        if ((lVar13 == -1) || (iVar8 == local_2d8->turn)) {
          lVar13 = std::__cxx11::string::find((char *)psVar2,0x10b681,0);
          pGVar11 = local_2d8;
          if ((lVar13 == -1) || (iVar8 == local_2d8->turn)) {
            lVar13 = std::__cxx11::string::find((char *)psVar2,0x10b685,0);
            if (lVar13 == -1) goto LAB_00106a38;
            Graphic::netchangeturn(&local_2da,local_2d8->turn,iVar8);
            local_2c8->ready = 1;
            local_2c8->started = 1;
            bVar6 = false;
            pNVar10 = local_2c8;
            goto LAB_00106a3b;
          }
          Game::put(local_2d8,local_1b8[0]._M_dataplus._M_p._4_4_,(int)local_1b8[0]._M_dataplus._M_p
                   );
          Graphic::Put(&local_2da,&pGVar11->board->delta);
        }
        else {
          Game::put(local_2d8,local_1b8[0]._M_dataplus._M_p._4_4_,(int)local_1b8[0]._M_dataplus._M_p
                    ,(int)local_2d0);
          Graphic::Put(&local_2da,&pGVar11->board->delta);
        }
        bVar6 = true;
        Graphic::netchangeturn(&local_2da,pGVar11->turn,iVar8);
      }
      else {
        local_2c8->closed = 1;
        pNVar10 = local_2c8;
LAB_00106a38:
        bVar6 = true;
      }
LAB_00106a3b:
      if ((undefined1 *)local_1b8[0]._M_string_length !=
          (undefined1 *)((long)&local_1b8[0].field_2 + 8)) {
        operator_delete((void *)local_1b8[0]._M_string_length);
      }
    } while (!bVar6);
  }
  do {
    if ((iVar7 != 0) && (local_2c8->closed != 0)) goto LAB_00106d0a;
    cVar5 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '\b');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_2b8,cVar5);
    iVar9 = std::__cxx11::string::compare((char *)&local_2b8);
    if (iVar9 != 0) break;
    bVar6 = (int)local_2d0 == 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\x1b[2;42H\x1b[0K",0xb);
    local_2d0 = (string *)CONCAT44(local_2d0._4_4_,(uint)bVar6);
  } while( true );
  iVar9 = std::__cxx11::string::compare((char *)&local_2b8);
  if (iVar9 == 0) {
    Net::closing(local_2c8);
  }
  else {
    std::__cxx11::stringstream::stringstream
              ((stringstream *)local_1b8,(string *)&local_2b8,_S_out|_S_in);
    iVar9 = __isoc99_sscanf(local_2b8,"%x %x",&local_2bc,&local_2c0);
    if (((iVar9 < 2) || (0xf < local_2bc)) || (0xf < local_2c0)) {
      piVar14 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar14,"");
      __cxa_throw(piVar14,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if (iVar7 == 0) {
LAB_00106d27:
    pGVar11 = local_2d8;
    if ((int)local_2d0 == 0) {
      bVar6 = Game::put(local_2d8,local_2bc,local_2c0);
      if (bVar6) {
        if (iVar7 == 1) {
          Net::put(local_2c8,local_2bc,local_2c0);
        }
        Graphic::Put(&local_2da,&pGVar11->board->delta);
        goto LAB_00106da4;
      }
LAB_00106dbb:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\x1b[2;42H\x1b[0K",0xb);
    }
    else {
      bVar6 = Game::put(local_2d8,local_2bc,local_2c0,1);
      if (!bVar6) goto LAB_00106dbb;
      if (iVar7 == 1) {
        Net::freeput(local_2c8,local_2bc,local_2c0);
      }
      Graphic::Put(&local_2da,&pGVar11->board->delta);
LAB_00106da4:
      if (iVar7 == 1) {
        Graphic::netchangeturn(&local_2da,pGVar11->turn,iVar8);
      }
      else {
        Graphic::changeturn(&local_2da,pGVar11->turn);
      }
    }
    if (pGVar11->full == true) {
      dialogbox::EndGameDialogBox(&local_2d9,pGVar11->b,pGVar11->w,pGVar11->howturn);
      Graphic::end(&local_2da);
      pGVar11->full = false;
    }
  }
  else {
LAB_00106d0a:
    if ((iVar8 == local_2d8->turn) && (local_2c8->ready != 0)) goto LAB_00106d27;
  }
  pNVar10 = local_2c8;
  if (((iVar7 != 1) || (local_2c8->closed != 1)) || (local_2c8->ready != 1)) goto LAB_001069be;
  dialogbox::ConnectionclosedDialogBox(&local_2d9);
  Graphic::end(&local_2da);
  pNVar10->ready = 0;
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  dialogbox::~dialogbox(&local_2d9);
  Graphic::~Graphic(&local_2da);
  iVar7 = 0;
LAB_00106e81:
  Net::~Net(pNVar10);
  operator_delete(pNVar10);
  pGVar11 = local_2d8;
  if (local_2d8 != (Game *)0x0) {
    Game::~Game(local_2d8);
    operator_delete(pGVar11);
  }
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  return iVar7;
}

Assistant:

int main(int argc, char *argv[]){
	std::string ip, pass, arg;
	long long room;
	int x, y, mode = -1, netmode = -1, netret, freeput = 0;
	std::unique_ptr<Game> game;
	std::unique_ptr<Net> net;
	try{
		mode=intGetOption("モードを選択してください\n0:オフラインで交互にプレイする 1:オンラインでプレイする場合 :");
		if(mode==0){//offline
			if(intGetOption("盤面サイズを指定しますか?\n0:指定しない 1:指定する :")==0) game.reset(new Game());
			else{
				std::string sx,sy;
				int x,y;
				x=intGetOption("8以下で縦のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
				y=intGetOption("8以下で横のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
				if(x>8||y>8)throw std::invalid_argument("");
				game.reset(new Game(x,y));
			}
		} else if(mode==1){//online
			net.reset(new Net());
			ip=strGetOption("サーバーのIPアドレスまたはドメインを入力してください:");
			netret=net->makeconnect(ip);
			if(netret){
				std::cout<<"通信エラー:終了します"<<std::endl;
				return 1;
			}
			netmode=intGetOption("モードを選択してください\n0:ホストとして部屋を立てる 1:ゲストとして部屋に入る 2:オートマッチング :");
			if(netmode==0){//host
				netmode=-1;
				if(netret==-1){
					std::cout<<"通信エラー:終了します"<<std::endl;
					return 1;
				}
				if(intGetOption("盤面サイズを指定しますか?\n0:指定しない 1:指定する :")==0){
					game.reset(new Game());
				} else{
					std::string sx,sy;
					int x,y;
					x=intGetOption("8以下で縦のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
					y=intGetOption("8以下で横のサイズを入力してください(盤面は入力された数値の倍のサイズになります):");
					if(x>8||y>8)throw std::invalid_argument("");
					game.reset(new Game(x,y));
				}
				std::cout<<"パスワードを設定しますか?"<<std::endl<<"0:設定しない 1:設定する :";
				std::cin>>arg;
				if(!arg.compare("1")){
					pass=strGetOption("パスワードを入力してください:");
					room=net->makeroom(game->board->boardx/2,game->board->boardy/2,pass);
				} else 	room=net->makeroom(game->board->boardx/2,game->board->boardy/2);
				std::cout<<"部屋番号:"<<std::hex<<room<<std::dec<<std::endl;
			} else if(netmode==1){//guest
				netmode=1;
				std::tuple<int,int> size;
				std::cin.setf(std::ios::hex,std::ios::basefield);
				room=llGetOption("部屋番号を入力してください:");
				std::cin.setf(std::ios::dec,std::ios::basefield);
				std::cout<<"パスワードが設定されていますか?"<<std::endl<<"0:設定されていない 1:設定されている :";
				std::cin>>arg;
				if(arg.compare("0")&&arg.compare("1"))throw std::invalid_argument("");
				else if(!arg.compare("1")){
					pass=strGetOption("パスワードを入力してください:");
					size=net->login(room,pass);
				} else{
					size=net->login(room);
				}
				if(std::get<0>(size)==-1){
					std::cout<<"通信エラー:終了します"<<std::endl;
					return 1;
				}
				game.reset(new Game(std::get<0>(size),std::get<1>(size)));
			} else if(netmode==2){//automatch
				room=net->automatch();
				if(room==0){
					netmode=-1;
					game.reset(new Game());
					net->makeroom(game->board->boardx/2,game->board->boardy/2);
				} else if(room!=-1){
					netmode=1;
					std::tuple<int,int> size;
					size=net->login(room);
					if(std::get<0>(size)==-1){
						std::cout<<"通信エラー:終了します"<<std::endl;
						return 1;
					}
					game.reset(new Game(std::get<0>(size),std::get<1>(size)));
				}
			} else throw std::invalid_argument("");
		} else  throw std::invalid_argument("");
	} catch(const std::invalid_argument &e){
		std::cout<<"入力が不正です:終了します";
		return 1;
	}
	Graphic graphic;
	dialogbox dialog;

	graphic.StartGame();
	graphic.Put(game->board->delta);
	if(mode==1){
		graphic.netchangeturn(game->turn,netmode);
		if(netmode==-1)graphic.netwait(std::to_string(room));
	}else graphic.changeturn(game->turn);
	std::string input;
	while(true){
		if(mode==1&&net->closed == 0&&(netmode!=game->turn||!net->ready)){
			std::tuple<std::string, int, int> action = net->get();
			if(std::get<0>(action).find("nodata")!=std::string::npos || std::get<0>(action).find("CLOSE")!=std::string::npos){
				net->closed = 1;
			} else if(std::get<0>(action).find("FREEPUT")!=std::string::npos && netmode != game->turn){
				game->put(std::get<1>(action), std::get<2>(action), freeput);
				graphic.Put(game->board->delta);
				graphic.netchangeturn(game->turn,netmode);
			} else if(std::get<0>(action).find("PUT")!=std::string::npos && netmode != game->turn){
				game->put(std::get<1>(action), std::get<2>(action));
				graphic.Put(game->board->delta);
				graphic.netchangeturn(game->turn,netmode);
			} else if(std::get<0>(action).find("READY")!=std::string::npos){
				graphic.netchangeturn(game->turn,netmode);
				net->started = 1;
				net->ready = 1;
				continue;
			}
		}
		while(mode==0||net->closed==0){
			std::getline(std::cin,input);
			if(!input.compare("free")){
				freeput=!freeput;
				std::cout<<"\e[2;42H\e[0K";
				continue;
			}else if(!input.compare("end")){
				net->closing();
				break;
			}
			try{
				std::stringstream stream(input);
				if(sscanf(input.c_str(),"%x %x",&x,&y)<2||x>15||y>15)throw std::invalid_argument("");
				break;
			}catch(const std::invalid_argument& e){
				std::cout<<"\e[2;42H\e[0K";
			}
		}
		if(mode == 0 || (netmode == game->turn&&net->ready)){
			if(freeput == 0){
				if(game->put(x, y)){
					if(mode == 1)net->put(x, y);
					graphic.Put(game->board->delta);
					if(mode == 1)graphic.netchangeturn(game->turn,netmode);
					else graphic.changeturn(game->turn);
				}else{
					std::cout<<"\e[2;42H\e[0K";
				}
			} else {
				if(game->put(x, y, freeput)){
					if(mode == 1)net->freeput(x, y);
					graphic.Put(game->board->delta);
					if(mode == 1)graphic.netchangeturn(game->turn,netmode);
					else graphic.changeturn(game->turn);
				}else{
					std::cout<<"\e[2;42H\e[0K";
				}
			}
			if(game->full){
				dialog.EndGameDialogBox(game->b, game->w, game->howturn);
				graphic.end();
				game->full = false;
			}
		}
			if(mode == 1 && net->closed == 1 && net->ready == 1){
				dialog.ConnectionclosedDialogBox();
				graphic.end();
				net->ready=0;
				break;
			}
	}
	return 0;
}